

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomLayoutItem::~DomLayoutItem(DomLayoutItem *this)

{
  DomWidget *this_00;
  DomLayout *this_01;
  DomSpacer *this_02;
  
  this_00 = this->m_widget;
  if (this_00 != (DomWidget *)0x0) {
    DomWidget::~DomWidget(this_00);
  }
  operator_delete(this_00,0x160);
  this_01 = this->m_layout;
  if (this_01 != (DomLayout *)0x0) {
    DomLayout::~DomLayout(this_01);
  }
  operator_delete(this_01,0x128);
  this_02 = this->m_spacer;
  if (this_02 != (DomSpacer *)0x0) {
    DomSpacer::~DomSpacer(this_02);
  }
  operator_delete(this_02,0x38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_alignment).d);
  return;
}

Assistant:

DomLayoutItem::~DomLayoutItem()
{
    delete m_widget;
    delete m_layout;
    delete m_spacer;
}